

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.cpp
# Opt level: O2

void duckdb::ListSearchFunction<true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t target_count;
  reference vector;
  Vector *source_v;
  reference target_v;
  
  target_count = input->count;
  vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  source_v = ListVector::GetEntry(vector);
  target_v = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
  ListSearchOp<true>(vector,source_v,target_v,result,target_count);
  if (target_count == 1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    return;
  }
  return;
}

Assistant:

static void ListSearchFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto target_count = input.size();
	auto &list_vec = input.data[0];
	auto &source_vec = ListVector::GetEntry(list_vec);
	auto &target_vec = input.data[1];

	ListSearchOp<RETURN_POSITION>(list_vec, source_vec, target_vec, result, target_count);

	if (target_count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}